

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::EncryptionWithColumnKey::printTo(EncryptionWithColumnKey *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_00000148;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"EncryptionWithColumnKey(");
  poVar1 = std::operator<<(local_10,"path_in_schema=");
  duckdb_apache::thrift::to_string<std::__cxx11::string>(in_stack_00000148);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"key_metadata=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>(in_stack_00000108);
    std::operator<<(poVar1,local_60);
    std::__cxx11::string::~string(local_60);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void EncryptionWithColumnKey::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "EncryptionWithColumnKey(";
  out << "path_in_schema=" << to_string(path_in_schema);
  out << ", " << "key_metadata="; (__isset.key_metadata ? (out << to_string(key_metadata)) : (out << "<null>"));
  out << ")";
}